

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

word Gia_ManRandomW(int fReset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = 0xdd8c5109;
  if (fReset == 0) {
    uVar2 = Gia_ManRandom::m_z;
  }
  uVar3 = (uVar2 >> 0x10) + (uVar2 & 0xffff) * 0x9069;
  uVar2 = 0x81962ff0;
  uVar1 = 0xdd8c5109;
  if (fReset == 0) {
    uVar2 = Gia_ManRandom::m_w;
    uVar1 = uVar3;
  }
  uVar4 = (uVar2 >> 0x10) + (uVar2 & 0xffff) * 18000;
  uVar2 = 0x81962ff0;
  if (fReset == 0) {
    uVar2 = uVar4;
  }
  Gia_ManRandom::m_z = (uVar1 >> 0x10) + (uVar1 & 0xffff) * 0x9069;
  Gia_ManRandom::m_w = (uVar2 >> 0x10) + (uVar2 & 0xffff) * 18000;
  return CONCAT44(uVar3 * 0x10000 + uVar4,Gia_ManRandom::m_z * 0x10000 + Gia_ManRandom::m_w);
}

Assistant:

word Gia_ManRandomW( int fReset )
{ 
    return ((word)Gia_ManRandom(fReset) << 32) | ((word)Gia_ManRandom(fReset) << 0);
}